

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_test.cc
# Opt level: O3

UniquePtr<BIGNUM> BIGNUMPow2(uint bit)

{
  int iVar1;
  UniquePtr<BIGNUM> extraout_RAX;
  int in_ESI;
  undefined4 in_register_0000003c;
  UniquePtr<BIGNUM> bn;
  _Head_base<0UL,_bignum_st_*,_false> local_18;
  
  local_18._M_head_impl = (bignum_st *)BN_new();
  if ((BIGNUM *)local_18._M_head_impl != (BIGNUM *)0x0) {
    iVar1 = BN_set_bit((BIGNUM *)local_18._M_head_impl,in_ESI);
    if (iVar1 != 0) {
      *(undefined8 *)CONCAT44(in_register_0000003c,bit) = local_18._M_head_impl;
      local_18._M_head_impl = (bignum_st *)0x0;
      goto LAB_001c0e04;
    }
  }
  *(undefined8 *)CONCAT44(in_register_0000003c,bit) = 0;
LAB_001c0e04:
  std::unique_ptr<bignum_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bignum_st,_bssl::internal::Deleter> *)&local_18);
  return (UniquePtr<BIGNUM>)
         extraout_RAX._M_t.super___uniq_ptr_impl<bignum_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_bignum_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bignum_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<BIGNUM> BIGNUMPow2(unsigned bit) {
  bssl::UniquePtr<BIGNUM> bn(BN_new());
  if (!bn ||  //
      !BN_set_bit(bn.get(), bit)) {
    return nullptr;
  }
  return bn;
}